

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O2

int read_face(p_ply_argument argument)

{
  uint32_t *puVar1;
  double dVar2;
  uint32_t **p_triangle;
  long value_index;
  long length;
  
  ply_get_argument_user_data(argument,&p_triangle,(long *)0x0);
  ply_get_argument_property(argument,(p_ply_property *)0x0,&length,&value_index);
  if ((ulong)value_index < 3) {
    dVar2 = ply_get_argument_value(argument);
    puVar1 = *p_triangle;
    *puVar1 = (uint32_t)(long)dVar2;
    *p_triangle = puVar1 + 1;
  }
  return 1;
}

Assistant:

static int read_face(p_ply_argument argument)
  {
  uint32_t** p_triangle;
  ply_get_argument_user_data(argument, (void**)&p_triangle, NULL);
  long length, value_index;
  ply_get_argument_property(argument, NULL, &length, &value_index);
  if (value_index >= 0 && value_index < 3)
    {
    double val = ply_get_argument_value(argument);
    *(*p_triangle) = (uint32_t)val;
    ++(*p_triangle);
    }
  return 1;
  }